

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void __thiscall xatlas::internal::raster::Triangle::computeUnitInwardNormals(Triangle *this)

{
  float fVar1;
  Vector2 VVar2;
  Vector2 VVar3;
  Vector2 VVar4;
  Vector2 VVar5;
  Vector2 VVar6;
  Vector2 VVar7;
  float fVar8;
  
  VVar2.y = (this->v1).y - (this->v2).y;
  VVar2.x = (this->v1).x - (this->v2).x;
  this->n1 = VVar2;
  fVar8 = (this->n1).y;
  fVar1 = (this->n1).x;
  (this->n1).x = -fVar8;
  (this->n1).y = fVar1;
  fVar8 = fVar8 * fVar8 + fVar1 * fVar1;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  VVar3.y = (1.0 / fVar8) * (this->n1).y;
  VVar3.x = (this->n1).x * (1.0 / fVar8);
  this->n1 = VVar3;
  VVar4.y = (this->v2).y - (this->v3).y;
  VVar4.x = (this->v2).x - (this->v3).x;
  this->n2 = VVar4;
  fVar8 = (this->n2).y;
  fVar1 = (this->n2).x;
  (this->n2).x = -fVar8;
  (this->n2).y = fVar1;
  fVar8 = fVar8 * fVar8 + fVar1 * fVar1;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  VVar5.y = (1.0 / fVar8) * (this->n2).y;
  VVar5.x = (this->n2).x * (1.0 / fVar8);
  this->n2 = VVar5;
  VVar6.y = (this->v3).y - (this->v1).y;
  VVar6.x = (this->v3).x - (this->v1).x;
  this->n3 = VVar6;
  fVar8 = (this->n3).y;
  fVar1 = (this->n3).x;
  (this->n3).x = -fVar8;
  (this->n3).y = fVar1;
  fVar8 = fVar8 * fVar8 + fVar1 * fVar1;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  VVar7.y = (1.0 / fVar8) * (this->n3).y;
  VVar7.x = (this->n3).x * (1.0 / fVar8);
  this->n3 = VVar7;
  return;
}

Assistant:

void computeUnitInwardNormals()
	{
		n1 = v1 - v2;
		n1 = Vector2(-n1.y, n1.x);
		n1 = n1 * (1.0f / sqrtf(n1.x * n1.x + n1.y * n1.y));
		n2 = v2 - v3;
		n2 = Vector2(-n2.y, n2.x);
		n2 = n2 * (1.0f / sqrtf(n2.x * n2.x + n2.y * n2.y));
		n3 = v3 - v1;
		n3 = Vector2(-n3.y, n3.x);
		n3 = n3 * (1.0f / sqrtf(n3.x * n3.x + n3.y * n3.y));
	}